

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

BinOpr expr_binop(LexState *ls,ExpDesc *v,uint32_t limit)

{
  int iVar1;
  BCPos BVar2;
  ExpKind EVar3;
  anon_union_8_3_2ce71dea_for_u aVar4;
  BCPos BVar5;
  BinOpr BVar6;
  BCReg BVar7;
  BCReg BVar8;
  BCReg BVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  ExpDesc *pEVar12;
  uint32_t uVar13;
  BinOpr BVar14;
  BCPos *l1;
  BCIns ins;
  ulong uVar15;
  uint uVar16;
  TValue *o;
  FuncState *pFVar17;
  GCstr *pGVar18;
  ExpDesc v2;
  ExpDesc *local_50;
  
  synlevel_begin(ls);
  iVar1 = ls->tok;
  switch(iVar1) {
  case 0x107:
    uVar11 = 0xffffffff00000001;
    goto LAB_0011e08d;
  case 0x108:
  case 0x10a:
  case 0x10b:
  case 0x10c:
  case 0x10d:
switchD_0011dfc4_caseD_108:
    expr_primary(ls,v);
    break;
  case 0x109:
    lj_lex_next(ls);
    parse_body(ls,v,0,ls->linenumber);
    break;
  case 0x10e:
    uVar11 = 0xffffffff00000000;
LAB_0011e08d:
    v->k = (int)uVar11;
    v->t = (int)((ulong)uVar11 >> 0x20);
    (v->u).s.info = 0;
    v->f = 0xffffffff;
LAB_0011e13a:
    lj_lex_next(ls);
    break;
  case 0x10f:
    lj_lex_next(ls);
    expr_binop(ls,v,8);
    pFVar17 = ls->fs;
    BVar5 = v->t;
    BVar2 = v->f;
    v->f = BVar5;
    v->t = BVar2;
    jmp_dropval(pFVar17,BVar5);
    jmp_dropval(pFVar17,v->t);
    expr_discharge(pFVar17,v);
    EVar3 = v->k;
    if (EVar3 < VKTRUE) {
      v->k = VKTRUE;
    }
    else if (EVar3 - VKTRUE < 4) {
      v->k = VKFALSE;
    }
    else if (EVar3 == VJMP) {
      *(byte *)&pFVar17->bcbase[(v->u).s.info - 1].ins =
           (byte)pFVar17->bcbase[(v->u).s.info - 1].ins ^ 1;
    }
    else {
      uVar16 = 0x13;
      if (EVar3 == VRELOCABLE) {
        bcreg_reserve(pFVar17,1);
        *(char *)((long)&pFVar17->bcbase[(v->u).s.info].ins + 1) = (char)pFVar17->freereg + -1;
        (v->u).s.info = pFVar17->freereg - 1;
        v->k = VNONRELOC;
      }
LAB_0011e21c:
      expr_free(pFVar17,v);
      BVar5 = bcemit_INS(pFVar17,(v->u).s.info << 0x10 | uVar16);
      (v->u).s.info = BVar5;
      v->k = VRELOCABLE;
    }
    break;
  default:
    if (iVar1 == 0x120) {
      v->k = VKSTR;
      v->t = 0xffffffff;
      (v->u).s.info = 0;
      v->f = 0xffffffff;
      (v->u).sval = (GCstr *)((ls->tokval).u64 & 0x7fffffffffff);
    }
    else {
      if (iVar1 == 0x2d) {
        lj_lex_next(ls);
        expr_binop(ls,v,8);
        pFVar17 = ls->fs;
        uVar16 = 0x14;
        if (v->t != v->f) {
LAB_0011e211:
          expr_toanyreg(pFVar17,v);
          goto LAB_0011e21c;
        }
        if (v->k == VKLAST) {
          if (((ulong)(v->u).sval & 0x7fffffffffffffff) == 0) goto LAB_0011e211;
          (v->u).sval = (GCstr *)((ulong)(v->u).sval ^ 0x8000000000000000);
        }
        else {
          if (v->k != VKCDATA) goto LAB_0011e211;
          uVar15 = (ulong)(v->u).sval & 0x7fffffffffff;
          if (*(short *)(uVar15 + 10) == 0x10) {
            *(byte *)(uVar15 + 0x1f) = *(byte *)(uVar15 + 0x1f) ^ 0x80;
          }
          else {
            *(long *)(uVar15 + 0x10) = -*(long *)(uVar15 + 0x10);
          }
        }
        break;
      }
      if (iVar1 == 0x7b) {
        expr_table(ls,v);
        break;
      }
      if (iVar1 == 0x114) {
        uVar11 = 0xffffffff00000002;
        goto LAB_0011e08d;
      }
      if (iVar1 == 0x118) {
        pFVar17 = ls->fs;
        if ((pFVar17->flags & 2) == 0) {
          err_syntax(ls,LJ_ERR_XDOTS);
        }
        bcreg_reserve(pFVar17,1);
        uVar13 = pFVar17->freereg - 1;
        BVar5 = bcemit_INS(pFVar17,(uint)pFVar17->numparams << 0x10 | uVar13 * 0x100 | 0x2000047);
        v->k = VCALL;
        (v->u).s.info = BVar5;
        v->t = 0xffffffff;
        v->f = 0xffffffff;
        (v->u).s.aux = uVar13;
      }
      else {
        if (iVar1 != 0x11e) {
          if (iVar1 != 0x23) goto switchD_0011dfc4_caseD_108;
          lj_lex_next(ls);
          expr_binop(ls,v,8);
          pFVar17 = ls->fs;
          uVar16 = 0x15;
          goto LAB_0011e211;
        }
        v->k = (ls->tokval).field_4.it >> 0xf == 0x1fff5 | VKLAST;
        (v->u).s.info = 0;
        v->t = 0xffffffff;
        v->f = 0xffffffff;
        v->u = (anon_union_8_3_2ce71dea_for_u)ls->tokval;
      }
    }
    goto LAB_0011e13a;
  }
  iVar1 = ls->tok;
  switch(iVar1) {
  case 0x110:
    BVar14 = OPR_OR;
    break;
  case 0x111:
  case 0x112:
  case 0x113:
  case 0x114:
  case 0x115:
  case 0x116:
  case 0x118:
    goto switchD_0011e266_caseD_26;
  case 0x117:
    BVar14 = OPR_CONCAT;
    break;
  case 0x119:
    BVar14 = OPR_EQ;
    break;
  case 0x11a:
    BVar14 = OPR_GE;
    break;
  case 0x11b:
    BVar14 = OPR_LE;
    break;
  case 0x11c:
    BVar14 = OPR_NE;
    break;
  default:
    switch(iVar1) {
    case 0x25:
      BVar14 = OPR_MOD;
      break;
    case 0x2a:
      BVar14 = OPR_MUL;
      break;
    case 0x2b:
      BVar14 = OPR_ADD;
      break;
    case 0x2d:
      BVar14 = OPR_SUB;
      break;
    case 0x2f:
      BVar14 = OPR_DIV;
      break;
    default:
      if (iVar1 == 0x3c) {
        BVar14 = OPR_LT;
        break;
      }
      if (iVar1 == 0x3e) {
        BVar14 = OPR_GT;
        break;
      }
      if (iVar1 == 0x5e) {
        BVar14 = OPR_POW;
        break;
      }
      if (iVar1 == 0x101) {
        BVar14 = OPR_AND;
        break;
      }
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
switchD_0011e266_caseD_26:
      BVar14 = OPR_NOBINOPR;
    }
  }
LAB_0011e2e2:
  do {
    if ((BVar14 == OPR_NOBINOPR) || (priority[BVar14].left <= limit)) {
      ls->level = ls->level - 1;
      return BVar14;
    }
    lj_lex_next(ls);
    pFVar17 = ls->fs;
    if (BVar14 == OPR_CONCAT) {
      expr_tonextreg(pFVar17,v);
    }
    else if (BVar14 == OPR_OR) {
      expr_discharge(pFVar17,v);
      EVar3 = v->k;
      if (EVar3 - VKTRUE < 3) {
        expr_toreg_nobranch(pFVar17,v,0xff);
        BVar5 = bcemit_jmp(pFVar17);
      }
      else {
        BVar5 = 0xffffffff;
        if (VKFALSE < EVar3) {
          if (EVar3 == VJMP) {
            BVar5 = (v->u).s.info;
          }
          else {
            BVar5 = bcemit_branch(pFVar17,v,1);
          }
        }
      }
      jmp_append(pFVar17,&v->t,BVar5);
      jmp_tohere(pFVar17,v->f);
      v->f = 0xffffffff;
    }
    else if (BVar14 == OPR_AND) {
      bcemit_branch_t(pFVar17,v);
    }
    else {
      if (BVar14 - OPR_NE < 2) {
        if (v->k < VKCDATA) {
LAB_0011e376:
          if (v->t == v->f) goto LAB_0011e3d5;
        }
      }
      else if (v->k == VKLAST) goto LAB_0011e376;
      expr_toanyreg(pFVar17,v);
    }
LAB_0011e3d5:
    local_50 = &v2;
    BVar6 = expr_binop(ls,local_50,(uint)priority[BVar14].right);
    pFVar17 = ls->fs;
    if (BVar14 < OPR_CONCAT) {
      if ((((v->k == VKLAST) && (v->t == v->f)) && (v2.k == VKLAST)) &&
         ((v2.t == v2.f &&
          (pGVar18 = (GCstr *)lj_vm_foldarith(v->u,(double)CONCAT44(v2.u.s.aux,v2.u.s.info),BVar14),
          ((ulong)pGVar18 & 0x7fffffffffffffff) < 0x7ff0000000000001)))) {
        (v->u).sval = pGVar18;
        BVar14 = BVar6;
      }
      else {
        if (BVar14 == OPR_POW) {
          BVar7 = expr_toanyreg(pFVar17,local_50);
          BVar8 = expr_toanyreg(pFVar17,v);
          BVar14 = 0x25;
        }
        else {
          expr_toval(pFVar17,local_50);
          if ((v2.k == VKLAST) && (BVar9 = const_num(pFVar17,local_50), BVar9 < 0x100)) {
            BVar14 = BVar14 + 0x16;
          }
          else {
            BVar14 = BVar14 | 0x20;
            BVar9 = expr_toanyreg(pFVar17,local_50);
          }
          expr_toval(pFVar17,v);
          if (((v->k == VKLAST) && (v2.k != VKLAST)) &&
             (BVar7 = const_num(pFVar17,v), BVar7 < 0x100)) {
            BVar14 = BVar14 - OPR_POW;
            BVar8 = BVar9;
          }
          else {
            BVar8 = expr_toanyreg(pFVar17,v);
            BVar7 = BVar9;
          }
        }
        if ((v->k == VNONRELOC) && (pFVar17->nactvar <= (v->u).s.info)) {
          pFVar17->freereg = pFVar17->freereg - 1;
        }
        if ((v2.k == VNONRELOC) && (pFVar17->nactvar <= v2.u.s.info)) {
          pFVar17->freereg = pFVar17->freereg - 1;
        }
        BVar5 = bcemit_INS(pFVar17,BVar7 << 0x10 | BVar8 << 0x18 | BVar14);
        (v->u).s.info = BVar5;
        v->k = VRELOCABLE;
        BVar14 = BVar6;
      }
      goto LAB_0011e2e2;
    }
    if (BVar14 != OPR_CONCAT) {
      if (BVar14 == OPR_OR) {
        expr_discharge(pFVar17,local_50);
        BVar5 = v->t;
        l1 = &v2.t;
      }
      else {
        if (BVar14 != OPR_AND) {
          expr_toval(pFVar17,v);
          pEVar12 = v;
          if (BVar14 - OPR_NE < 2) {
            uVar16 = BVar14 == OPR_EQ ^ 5;
            if (v->k < VKCDATA) {
              pEVar12 = local_50;
              local_50 = v;
            }
            BVar9 = expr_toanyreg(pFVar17,pEVar12);
            expr_toval(pFVar17,local_50);
            EVar3 = local_50->k;
            if (EVar3 < VKSTR) {
              ins = EVar3 << 0x10 | uVar16 + 6 + BVar9 * 0x100;
            }
            else if (EVar3 == VKSTR) {
              BVar7 = const_str(pFVar17,local_50);
              ins = (BVar7 << 0x10 | BVar9 << 8) + uVar16 + 2;
            }
            else if (EVar3 == VKLAST) {
              BVar7 = const_num(pFVar17,local_50);
              ins = BVar7 << 0x10 | BVar9 * 0x100 + uVar16 + 4;
            }
            else {
              BVar7 = expr_toanyreg(pFVar17,local_50);
              ins = BVar7 << 0x10 | BVar9 * 0x100 | uVar16;
            }
          }
          else {
            uVar16 = BVar14 - OPR_LT;
            if ((uVar16 & 1) == 0) {
              BVar9 = expr_toanyreg(pFVar17,local_50);
              BVar7 = expr_toanyreg(pFVar17,v);
            }
            else {
              uVar16 = uVar16 ^ 3;
              expr_toval(pFVar17,local_50);
              BVar7 = expr_toanyreg(pFVar17,local_50);
              BVar9 = expr_toanyreg(pFVar17,v);
              pEVar12 = local_50;
              local_50 = v;
            }
            ins = BVar9 << 0x10 | BVar7 << 8 | uVar16;
          }
          if ((pEVar12->k == VNONRELOC) && (pFVar17->nactvar <= (pEVar12->u).s.info)) {
            pFVar17->freereg = pFVar17->freereg - 1;
          }
          if ((local_50->k == VNONRELOC) && (pFVar17->nactvar <= (local_50->u).s.info)) {
            pFVar17->freereg = pFVar17->freereg - 1;
          }
          bcemit_INS(pFVar17,ins);
          BVar5 = bcemit_jmp(pFVar17);
          (v->u).s.info = BVar5;
          v->k = VJMP;
          BVar14 = BVar6;
          goto LAB_0011e2e2;
        }
        expr_discharge(pFVar17,local_50);
        BVar5 = v->f;
        l1 = &v2.f;
      }
      jmp_append(pFVar17,l1,BVar5);
      *(ulong *)&v->f = CONCAT44(v2._20_4_,v2.f);
      aVar4.s.aux = v2.u.s.aux;
      aVar4.s.info = v2.u.s.info;
      v->u = aVar4;
      v->k = v2.k;
      v->t = v2.t;
      BVar14 = BVar6;
      goto LAB_0011e2e2;
    }
    expr_toval(pFVar17,local_50);
    if ((v2.k == VRELOCABLE) && ((char)pFVar17->bcbase[v2.u.s.info].ins == '&')) {
      expr_free(pFVar17,v);
      *(undefined1 *)((long)&pFVar17->bcbase[v2.u.s.info].ins + 3) = *(undefined1 *)&v->u;
      uVar10 = v2.u.s.info;
    }
    else {
      expr_tonextreg(pFVar17,local_50);
      if ((v2.k == VNONRELOC) && (pFVar17->nactvar <= v2.u.s.info)) {
        pFVar17->freereg = pFVar17->freereg - 1;
      }
      expr_free(pFVar17,v);
      uVar10 = bcemit_INS(pFVar17,v2.u.s.info << 0x10 | (v->u).s.info << 0x18 | 0x26);
    }
    (v->u).s.info = uVar10;
    v->k = VRELOCABLE;
    BVar14 = BVar6;
  } while( true );
}

Assistant:

static BinOpr expr_binop(LexState *ls, ExpDesc *v, uint32_t limit)
{
  BinOpr op;
  synlevel_begin(ls);
  expr_unop(ls, v);
  op = token2binop(ls->tok);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    ExpDesc v2;
    BinOpr nextop;
    lj_lex_next(ls);
    bcemit_binop_left(ls->fs, op, v);
    /* Parse binary expression with higher priority. */
    nextop = expr_binop(ls, &v2, priority[op].right);
    bcemit_binop(ls->fs, op, v, &v2);
    op = nextop;
  }
  synlevel_end(ls);
  return op;  /* Return unconsumed binary operator (if any). */
}